

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O2

Error __thiscall
asmjit::x86::Assembler::align(Assembler *this,uint32_t alignMode,uint32_t alignment)

{
  Logger *pLVar1;
  uint8_t uVar2;
  Error EVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Error EStack_e0;
  uint32_t alignment_local;
  CodeWriter writer;
  
  alignment_local = alignment;
  if ((this->super_BaseAssembler).super_BaseEmitter._code == (CodeHolder *)0x0) {
    EStack_e0 = 5;
  }
  else {
    if (alignMode < 3) {
      if (alignment < 2) {
        return 0;
      }
      if ((alignment < 0x41) &&
         (uVar4 = alignment - (alignment >> 1 & 0x55555555),
         uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333),
         ((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) {
        writer._cursor = (this->super_BaseAssembler)._bufferPtr;
        lVar5 = (long)writer._cursor - (long)(this->super_BaseAssembler)._bufferData;
        uVar9 = (-(ulong)alignment & (ulong)alignment + 0xffffffff + lVar5) - lVar5;
        if ((int)uVar9 != 0) {
          EVar3 = CodeWriter::ensureSpace(&writer,&this->super_BaseAssembler,uVar9 & 0xffffffff);
          if (EVar3 != 0) {
            return EVar3;
          }
          if (alignMode == 1) {
            uVar2 = 0xcc;
          }
          else if (alignMode == 0) {
            uVar2 = 0x90;
            if (((this->super_BaseAssembler).super_BaseEmitter._encodingOptions & 2) != 0) {
              do {
                uVar7 = (uint)uVar9;
                uVar4 = 9;
                if (uVar7 < 9) {
                  uVar4 = uVar7;
                }
                uVar6 = uVar7;
                if (8 < (uVar9 & 0xffffffff)) {
                  uVar6 = 9;
                }
                lVar5 = 0;
                do {
                  *writer._cursor = align::nopData[uVar4 - 1][lVar5];
                  writer._cursor = writer._cursor + 1;
                  lVar5 = lVar5 + 1;
                } while (uVar6 != (uint)lVar5);
                uVar9 = (ulong)(uVar7 - uVar4);
              } while (uVar7 - uVar4 != 0);
              uVar9 = 0;
            }
          }
          else {
            uVar2 = '\0';
          }
          while (iVar8 = (int)uVar9, uVar9 = (ulong)(iVar8 - 1), iVar8 != 0) {
            *writer._cursor = uVar2;
            writer._cursor = writer._cursor + 1;
          }
          CodeWriter::done(&writer,&this->super_BaseAssembler);
        }
        pLVar1 = (this->super_BaseAssembler).super_BaseEmitter._logger;
        if (pLVar1 == (Logger *)0x0) {
          return 0;
        }
        writer._cursor = (uint8_t *)0x20;
        String::appendChars((String *)&writer,' ',(ulong)(pLVar1->_options)._indentation[0]);
        String::appendFormat<unsigned_int&>((String *)&writer,"align %u\n",&alignment_local);
        Logger::log((this->super_BaseAssembler).super_BaseEmitter._logger,
                    (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        String::reset((String *)&writer);
        return 0;
      }
    }
    EStack_e0 = 2;
  }
  EVar3 = BaseEmitter::reportError((BaseEmitter *)this,EStack_e0,(char *)0x0);
  return EVar3;
}

Assistant:

Error Assembler::align(uint32_t alignMode, uint32_t alignment) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (ASMJIT_UNLIKELY(alignMode >= kAlignCount))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment <= 1)
    return kErrorOk;

  if (ASMJIT_UNLIKELY(!Support::isPowerOf2(alignment) || alignment > Globals::kMaxAlignment))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t i = uint32_t(Support::alignUpDiff<size_t>(offset(), alignment));
  if (i > 0) {
    CodeWriter writer(this);
    ASMJIT_PROPAGATE(writer.ensureSpace(this, i));

    uint8_t pattern = 0x00;
    switch (alignMode) {
      case kAlignCode: {
        if (hasEncodingOption(kEncodingOptionOptimizedAlign)) {
          // Intel 64 and IA-32 Architectures Software Developer's Manual - Volume 2B (NOP).
          enum { kMaxNopSize = 9 };

          static const uint8_t nopData[kMaxNopSize][kMaxNopSize] = {
            { 0x90 },
            { 0x66, 0x90 },
            { 0x0F, 0x1F, 0x00 },
            { 0x0F, 0x1F, 0x40, 0x00 },
            { 0x0F, 0x1F, 0x44, 0x00, 0x00 },
            { 0x66, 0x0F, 0x1F, 0x44, 0x00, 0x00 },
            { 0x0F, 0x1F, 0x80, 0x00, 0x00, 0x00, 0x00 },
            { 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 },
            { 0x66, 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 }
          };

          do {
            uint32_t n = Support::min<uint32_t>(i, kMaxNopSize);
            const uint8_t* src = nopData[n - 1];

            i -= n;
            do {
              writer.emit8(*src++);
            } while (--n);
          } while (i);
        }

        pattern = 0x90;
        break;
      }

      case kAlignData:
        pattern = 0xCC;
        break;

      case kAlignZero:
        // Pattern already set to zero.
        break;
    }

    while (i) {
      writer.emit8(pattern);
      i--;
    }

    writer.done(this);
  }

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<128> sb;
    sb.appendChars(' ', _logger->indentation(FormatOptions::kIndentationCode));
    sb.appendFormat("align %u\n", alignment);
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}